

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

Vec_Ptr_t * Saig_ManGetRegistersToExclude(Aig_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  Aig_Obj_t *pAVar5;
  bool local_5d;
  int local_30;
  int local_2c;
  int Diffs;
  int i;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *p_local;
  
  iVar2 = Saig_ManRegNum(p);
  if (iVar2 < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                  ,0x1be,"Vec_Ptr_t *Saig_ManGetRegistersToExclude(Aig_Man_t *)");
  }
  for (local_2c = 0; iVar2 = Saig_ManRegNum(p), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar4 = p->vCos;
    iVar2 = Saig_ManPoNum(p);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar4,local_2c + iVar2);
    pAVar5 = Aig_ObjFanin0(pAVar3);
    iVar2 = Aig_ObjFaninC0(pAVar3);
    if (iVar2 == 0) {
      *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffef | 0x10;
    }
    else {
      *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffdf | 0x20;
    }
  }
  local_30 = 0;
  for (local_2c = 0; iVar2 = Saig_ManRegNum(p), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar4 = p->vCos;
    iVar2 = Saig_ManPoNum(p);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar4,local_2c + iVar2);
    pAVar3 = Aig_ObjFanin0(pAVar3);
    local_5d = false;
    if ((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) != 0) {
      local_5d = (*(ulong *)&pAVar3->field_0x18 >> 5 & 1) != 0;
    }
    local_30 = (uint)local_5d + local_30;
  }
  pVVar4 = Vec_PtrAlloc(100);
  if (0 < local_30) {
    for (local_2c = 0; iVar2 = Saig_ManRegNum(p), local_2c < iVar2; local_2c = local_2c + 1) {
      pVVar1 = p->vCos;
      iVar2 = Saig_ManPoNum(p);
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_2c + iVar2);
      pAVar5 = Aig_ObjFanin0(pAVar3);
      if (((*(ulong *)&pAVar5->field_0x18 >> 4 & 1) != 0) &&
         ((*(ulong *)&pAVar5->field_0x18 >> 5 & 1) != 0)) {
        Vec_PtrPush(pVVar4,pAVar3);
      }
    }
    iVar2 = Vec_PtrSize(pVVar4);
    if (iVar2 != local_30) {
      __assert_fail("Vec_PtrSize(vNodes) == Diffs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x1d6,"Vec_Ptr_t *Saig_ManGetRegistersToExclude(Aig_Man_t *)");
    }
  }
  for (local_2c = 0; iVar2 = Saig_ManRegNum(p), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar1 = p->vCos;
    iVar2 = Saig_ManPoNum(p);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_2c + iVar2);
    pAVar3 = Aig_ObjFanin0(pAVar3);
    *(ulong *)&pAVar3->field_0x18 = *(ulong *)&pAVar3->field_0x18 & 0xffffffffffffffdf;
    *(ulong *)&pAVar3->field_0x18 = *(ulong *)&pAVar3->field_0x18 & 0xffffffffffffffef;
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Saig_ManGetRegistersToExclude( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pFanin;
    int i, Diffs;
    assert( Saig_ManRegNum(p) > 0 );
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( !Aig_ObjFaninC0(pObj) )
            pFanin->fMarkA = 1;
        else
            pFanin->fMarkB = 1;
    }
    Diffs = 0;
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        Diffs += pFanin->fMarkA && pFanin->fMarkB;
    }
    vNodes = Vec_PtrAlloc( 100 );
    if ( Diffs > 0 )
    {
        Saig_ManForEachLi( p, pObj, i )
        {
            pFanin = Aig_ObjFanin0(pObj);
            if ( pFanin->fMarkA && pFanin->fMarkB )
                Vec_PtrPush( vNodes, pObj );
        }
        assert( Vec_PtrSize(vNodes) == Diffs );
    }
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
    return vNodes;
}